

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void dec_update_map_for_intra
               (com_scu_t *map_scu,s8 *map_ipm,int tb_x,int tb_y,int tb_w,int tb_h,int i_scu,int ipm
               )

{
  uint uVar1;
  int iVar2;
  s8 *psVar3;
  com_scu_t *pcVar4;
  int iVar5;
  int i;
  ulong uVar6;
  
  iVar5 = tb_h >> 2;
  iVar2 = (tb_y >> 2) * i_scu + (tb_x >> 2);
  psVar3 = map_ipm + iVar2;
  pcVar4 = map_scu + iVar2;
  uVar1 = tb_w >> 2;
  if (tb_w >> 2 < 1) {
    uVar1 = 0;
  }
  iVar2 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    iVar2 = 0;
  }
  for (; iVar2 != iVar5; iVar2 = iVar2 + 1) {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      psVar3[uVar6] = (s8)ipm;
      pcVar4[uVar6] = (com_scu_t)0x3;
    }
    psVar3 = psVar3 + i_scu;
    pcVar4 = pcVar4 + i_scu;
  }
  return;
}

Assistant:

void dec_update_map_for_intra(com_scu_t *map_scu, s8 *map_ipm, int tb_x, int tb_y, int tb_w, int tb_h, int i_scu, int ipm)
{
    int scu_x = tb_x >> MIN_CU_LOG2;
    int scu_y = tb_y >> MIN_CU_LOG2;
    int scu_w = tb_w >> MIN_CU_LOG2;
    int scu_h = tb_h >> MIN_CU_LOG2;
    int scup = scu_y * i_scu + scu_x;
    com_scu_t scu = { 0 };
    scu.coded = 1;
    scu.intra = 1;

    map_ipm += scup;
    map_scu += scup;

    for (int j = 0; j < scu_h; j++) {
        for (int i = 0; i < scu_w; i++) {
            map_ipm[i] = ipm;
            map_scu[i] = scu;
        }
        map_ipm += i_scu;
        map_scu += i_scu;
    }
}